

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void QIconModeViewBase::addLeaf(QList<int> *leaf,QRect *area,uint visited,Data data)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  long *plVar5;
  QList<QModelIndex> *this;
  char cVar6;
  undefined4 uVar7;
  pointer pQVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((leaf->d).size != 0) {
    uVar11 = 0;
    do {
      uVar12 = (ulong)(leaf->d).ptr[uVar11];
      if ((-1 < (long)uVar12) && (uVar12 < *(ulong *)((long)data.field_0 + 0x70))) {
        pQVar8 = QList<QListViewItem>::data((QList<QListViewItem> *)((long)data.field_0 + 0x60));
        iVar1 = pQVar8[uVar12].x;
        iVar9 = pQVar8[uVar12].w + iVar1 + -1;
        if (iVar1 <= iVar9) {
          iVar2 = pQVar8[uVar12].y;
          iVar10 = pQVar8[uVar12].h + iVar2 + -1;
          if ((iVar2 <= iVar10) && (-1 < pQVar8[uVar12].indexHint)) {
            local_50.c = iVar2;
            local_50.r = iVar1;
            local_50.i = CONCAT44(iVar10,iVar9);
            cVar6 = QRect::intersects((QRect *)&local_50);
            if ((cVar6 != '\0') && (pQVar8 = pQVar8 + uVar12, pQVar8->visited != visited)) {
              local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_68.r = -0x55555556;
              local_68.c = -0x55555556;
              local_68.i._0_4_ = 0xaaaaaaaa;
              local_68.i._4_4_ = 0xaaaaaaaa;
              lVar4 = *(long *)((long)data.field_0 + 8);
              plVar5 = *(long **)(lVar4 + 0x2f8);
              uVar7 = (**(code **)(**(long **)(lVar4 + 0x540) + 0x10))
                                (*(long **)(lVar4 + 0x540),pQVar8);
              uVar3 = *(undefined4 *)(lVar4 + 0x590);
              QPersistentModelIndex::operator_cast_to_QModelIndex
                        (&local_50,(QPersistentModelIndex *)(lVar4 + 0x3b8));
              (**(code **)(*plVar5 + 0x60))(&local_68,plVar5,uVar7,uVar3,&local_50);
              this = *(QList<QModelIndex> **)((long)data.field_0 + 0xb0);
              QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                        ((QMovableArrayOps<QModelIndex> *)this,(this->d).size,&local_68);
              QList<QModelIndex>::end(this);
              pQVar8->visited = visited;
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(leaf->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::addLeaf(QList<int> &leaf, const QRect &area, uint visited,
                                QBspTree::Data data)
{
    QListViewItem *vi;
    QIconModeViewBase *_this = static_cast<QIconModeViewBase *>(data.ptr);
    for (int i = 0; i < leaf.size(); ++i) {
        int idx = leaf.at(i);
        if (idx < 0 || idx >= _this->items.size())
            continue;
        vi = &_this->items[idx];
        Q_ASSERT(vi);
        if (vi->isValid() && vi->rect().intersects(area) && vi->visited != visited) {
            QModelIndex index  = _this->dd->listViewItemToIndex(*vi);
            Q_ASSERT(index.isValid());
            _this->interSectingVector->append(index);
            vi->visited = visited;
        }
    }
}